

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O0

Clause * __thiscall
Inferences::DuplicateLiteralRemovalISE::simplify(DuplicateLiteralRemovalISE *this,Clause *c)

{
  bool bVar1;
  int iVar2;
  Literal **ppLVar3;
  Elem ppLVar4;
  size_t sVar5;
  Literal **ppLVar6;
  DArray<Kernel::Literal_*> *pDVar7;
  Clause *in_RSI;
  bool bVar8;
  int newIdx;
  int origIdx;
  Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> resLits;
  int newLength;
  Literal *lit;
  StlIter __end3;
  StlIter __begin3;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range3;
  int length;
  StlIter *in_stack_fffffffffffffe88;
  Inference *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  Clause *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffeb0;
  DArray<Kernel::Literal_*> *in_stack_fffffffffffffeb8;
  Literal *pLVar9;
  Literal *in_stack_fffffffffffffed0;
  Inference *in_stack_fffffffffffffee0;
  uint size;
  SimplifyingInference1 local_d8;
  Inference local_c8;
  int local_98;
  uint local_94;
  Literal *local_90 [2];
  int local_7c;
  Literal *local_78;
  undefined1 local_50 [24];
  undefined1 *local_38;
  uint local_1c;
  Clause *local_18;
  Clause *local_8;
  
  local_18 = in_RSI;
  local_1c = Kernel::Clause::length(in_RSI);
  if ((int)local_1c < 2) {
    local_8 = local_18;
  }
  else {
    if ((simplify(Kernel::Clause*)::skipped == '\0') &&
       (iVar2 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::skipped), iVar2 != 0)) {
      Lib::Stack<Kernel::Literal_*>::Stack
                ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffea0,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      __cxa_atexit(Lib::Stack<Kernel::Literal_*>::~Stack,&simplify::skipped,&__dso_handle);
      __cxa_guard_release(&simplify(Kernel::Clause*)::skipped);
    }
    Lib::Stack<Kernel::Literal_*>::reset(&simplify::skipped);
    if (local_1c == 2) {
      ppLVar3 = Kernel::Clause::operator[](local_18,0);
      pLVar9 = *ppLVar3;
      ppLVar3 = Kernel::Clause::operator[](local_18,1);
      if (pLVar9 != *ppLVar3) {
        return local_18;
      }
      Kernel::Clause::operator[](local_18,0);
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe90,
                 (Literal *)in_stack_fffffffffffffe88);
    }
    else if (local_1c == 3) {
      ppLVar3 = Kernel::Clause::operator[](local_18,0);
      pLVar9 = *ppLVar3;
      ppLVar3 = Kernel::Clause::operator[](local_18,1);
      if (pLVar9 == *ppLVar3) {
        Kernel::Clause::operator[](local_18,0);
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe90,
                   (Literal *)in_stack_fffffffffffffe88);
        ppLVar3 = Kernel::Clause::operator[](local_18,0);
        pLVar9 = *ppLVar3;
        ppLVar3 = Kernel::Clause::operator[](local_18,2);
        if (pLVar9 == *ppLVar3) {
          Kernel::Clause::operator[](local_18,0);
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe90,
                     (Literal *)in_stack_fffffffffffffe88);
        }
      }
      else {
        ppLVar3 = Kernel::Clause::operator[](local_18,0);
        pLVar9 = *ppLVar3;
        ppLVar3 = Kernel::Clause::operator[](local_18,2);
        if (pLVar9 != *ppLVar3) {
          ppLVar3 = Kernel::Clause::operator[](local_18,1);
          pLVar9 = *ppLVar3;
          ppLVar3 = Kernel::Clause::operator[](local_18,2);
          if (pLVar9 != *ppLVar3) {
            return local_18;
          }
        }
        Kernel::Clause::operator[](local_18,2);
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe90,
                   (Literal *)in_stack_fffffffffffffe88);
      }
    }
    else {
      if ((simplify(Kernel::Clause*)::seen == '\0') &&
         (iVar2 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::seen), iVar2 != 0)) {
        Lib::DHSet<Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2>::DHSet
                  ((DHSet<Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x7f4021);
        __cxa_atexit(Lib::DHSet<Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHSet,
                     &simplify::seen,&__dso_handle);
        __cxa_guard_release(&simplify(Kernel::Clause*)::seen);
      }
      Lib::DHSet<Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
                ((DHSet<Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x7f4055);
      Kernel::Clause::iterLits(in_stack_fffffffffffffea0);
      local_38 = local_50;
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
      ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
               *)in_stack_fffffffffffffe88);
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
      ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
             *)in_stack_fffffffffffffe88);
      while (bVar8 = Lib::operator!=((StlIter *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88)
            , bVar8) {
        ppLVar4 = Lib::
                  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
                  ::StlIter::operator*((StlIter *)0x7f40cc);
        local_78 = *ppLVar4;
        bVar8 = Lib::DHSet<Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                          ((DHSet<Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                           in_stack_fffffffffffffe90,(Literal *)in_stack_fffffffffffffe88);
        if (!bVar8) {
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe90,
                     (Literal *)in_stack_fffffffffffffe88);
        }
        Lib::
        IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
        ::StlIter::operator++((StlIter *)in_stack_fffffffffffffe90);
      }
      bVar8 = Lib::Stack<Kernel::Literal_*>::isEmpty(&simplify::skipped);
      if (bVar8) {
        return local_18;
      }
    }
    size = local_1c;
    sVar5 = Lib::Stack<Kernel::Literal_*>::length(&simplify::skipped);
    local_7c = size - (int)sVar5;
    ppLVar3 = local_90;
    Lib::Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    Recycled((Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_fffffffffffffe90);
    Lib::Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator->((Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x7f41ac);
    Lib::DArray<Kernel::Literal_*>::ensure(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    local_98 = local_7c;
    local_94 = local_1c;
    while( true ) {
      local_94 = local_94 - 1;
      local_98 = local_98 + -1;
      if (local_98 < 0) break;
      while( true ) {
        bVar1 = Lib::Stack<Kernel::Literal_*>::isNonEmpty(&simplify::skipped);
        bVar8 = false;
        if (bVar1) {
          in_stack_fffffffffffffee0 = (Inference *)Kernel::Clause::operator[](local_18,local_94);
          in_stack_fffffffffffffed0 = *(Literal **)in_stack_fffffffffffffee0;
          ppLVar6 = Lib::Stack<Kernel::Literal_*>::top(&simplify::skipped);
          bVar8 = in_stack_fffffffffffffed0 == *ppLVar6;
        }
        if (!bVar8) break;
        Lib::Stack<Kernel::Literal_*>::pop(&simplify::skipped);
        local_94 = local_94 - 1;
      }
      ppLVar6 = Kernel::Clause::operator[](local_18,local_94);
      pLVar9 = *ppLVar6;
      pDVar7 = Lib::
               Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               ::operator*((Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                            *)0x7f42e7);
      ppLVar6 = Lib::DArray<Kernel::Literal_*>::operator[](pDVar7,(long)local_98);
      *ppLVar6 = pLVar9;
    }
    *(uint *)(DAT_01333840 + 0x138) = *(int *)(DAT_01333840 + 0x138) + (local_1c - local_7c);
    pDVar7 = Lib::
             Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
             operator->((Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x7f4371);
    Lib::DArray<Kernel::Literal_*>::begin(pDVar7);
    Kernel::SimplifyingInference1::SimplifyingInference1
              (&local_d8,REMOVE_DUPLICATE_LITERALS,local_18);
    Kernel::Inference::Inference
              (in_stack_fffffffffffffe90,(SimplifyingInference1 *)in_stack_fffffffffffffe88);
    local_8 = Kernel::Clause::fromArray(ppLVar3,size,in_stack_fffffffffffffee0);
    Kernel::Inference::~Inference(&local_c8);
    Lib::Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled((Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)in_stack_fffffffffffffed0);
  }
  return local_8;
}

Assistant:

Clause* DuplicateLiteralRemovalISE::simplify(Clause* c)
{
  int length = c->length();
  if (length <= 1) {
    return c;
  }

  //literals that will be skipped, skipping starts on the top of the stack
  //and goes from the end of the clause
  static LiteralStack skipped;
  skipped.reset();

  //we handle low length specially, not to have to use the set
  if(length==2) {
    if((*c)[0]!=(*c)[1]) {
      return c;
    }
    skipped.push((*c)[0]);
  }
  else if(length==3) {
    if((*c)[0]!=(*c)[1]) {
      if((*c)[0]!=(*c)[2]) {
        if((*c)[1]!=(*c)[2]) {
          return c;
        }
      }
      skipped.push((*c)[2]);
    }
    else { //(*c)[0]==(*c)[1]
      skipped.push((*c)[0]);
      if((*c)[0]==(*c)[2]) {
        //all are equal
        skipped.push((*c)[0]);
      }
    }
  }
  else {
    static DHSet<Literal*> seen;
    seen.reset();
    //here we rely on the fact that the iterator traverses the clause from
    //the first to the last literal
    for (Literal* lit : c->iterLits()) {
      if(!seen.insert(lit)) {
        skipped.push(lit);
      }
    }
    if(skipped.isEmpty()) {
      return c;
    }
  }

  ASS(skipped.isNonEmpty());

  // there are duplicate literals, delete them from lits
  int newLength = length - skipped.length();
  // now lits[0 ... newLength-1] contain the remaining literals
  Recycled<DArray<Literal*>> resLits;
  resLits->ensure(newLength);

  int origIdx = length-1;

  for(int newIdx=newLength-1; newIdx>=0; newIdx--,origIdx--) {
    while(skipped.isNonEmpty() && (*c)[origIdx]==skipped.top()) {
      skipped.pop();
      origIdx--;
      ASS_GE(origIdx,0);
    }
    (*resLits)[newIdx] = (*c)[origIdx];
  }
  ASS(skipped.isEmpty());
  ASS_EQ(origIdx,-1);
  env.statistics->duplicateLiterals += length - newLength;

#if DEBUG_DUPLICATE_LITERALS
  {
    static DHSet<Literal*> origLits;
    origLits.reset();
    static DHSet<Literal*> newLits;
    newLits.reset();
    origLits.loadFromIterator(c->iterLits());
    newLits.loadFromIterator(d->iterLits());
    ASS_EQ(origLits.size(),newLits.size());
    ASS_EQ(origLits.size(), static_cast<unsigned>(newLength));
  }
#endif

  return Clause::fromArray(resLits->begin(), newLength,
			 SimplifyingInference1(InferenceRule::REMOVE_DUPLICATE_LITERALS,c));
}